

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ibuf.c
# Opt level: O0

void * ibuf_reserve_slow(ibuf *ibuf,size_t size)

{
  slab_cache *cache;
  size_t __n;
  size_t sVar1;
  slab *slab_00;
  char *pcVar2;
  slab *slab_01;
  char *ptr;
  slab *slab;
  size_t new_capacity;
  size_t capacity;
  size_t used;
  size_t size_local;
  ibuf *ibuf_local;
  
  if (ibuf->wpos + size <= ibuf->end) {
    __assert_fail("ibuf->wpos + size > ibuf->end",
                  "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/small/ibuf.c"
                  ,0x48,"void *ibuf_reserve_slow(struct ibuf *, size_t)");
  }
  __n = ibuf_used(ibuf);
  sVar1 = ibuf_capacity(ibuf);
  if (sVar1 < size + __n) {
    slab = (slab *)(sVar1 << 1);
    if (slab < (slab *)ibuf->start_capacity) {
      slab = (slab *)ibuf->start_capacity;
    }
    for (; slab < (slab *)(__n + size); slab = (slab *)((long)slab << 1)) {
    }
    slab_00 = slab_get(ibuf->slabc,(size_t)slab);
    if (slab_00 == (slab *)0x0) {
      return (void *)0x0;
    }
    pcVar2 = (char *)slab_data(slab_00);
    memcpy(pcVar2,ibuf->rpos,__n);
    if (ibuf->buf != (char *)0x0) {
      cache = ibuf->slabc;
      slab_01 = slab_from_data(ibuf->buf);
      slab_put(cache,slab_01);
    }
    ibuf->buf = pcVar2;
    pcVar2 = ibuf->buf;
    sVar1 = slab_capacity(slab_00);
    ibuf->end = pcVar2 + sVar1;
  }
  else {
    ibuf_unpoison_consumed(ibuf);
    ibuf_unpoison_unallocated(ibuf);
    memmove(ibuf->buf,ibuf->rpos,__n);
  }
  ibuf->rpos = ibuf->buf;
  ibuf->wpos = ibuf->rpos + __n;
  return ibuf->wpos;
}

Assistant:

void *
ibuf_reserve_slow(struct ibuf *ibuf, size_t size)
{
	assert(ibuf->wpos + size > ibuf->end);
	size_t used = ibuf_used(ibuf);
	size_t capacity = ibuf_capacity(ibuf);
	/*
	 * Check if we have enough space in the
	 * current buffer. In this case de-fragment it
	 * by moving existing data to the beginning.
	 * Otherwise, get a bigger buffer.
	 */
	if (size + used <= capacity) {
		ibuf_unpoison_consumed(ibuf);
		ibuf_unpoison_unallocated(ibuf);
		memmove(ibuf->buf, ibuf->rpos, used);
	} else {
		/* Use start_capacity as allocation factor. */
		size_t new_capacity = capacity * 2;
		if (new_capacity < ibuf->start_capacity)
			new_capacity = ibuf->start_capacity;

		while (new_capacity < used + size)
			new_capacity *= 2;

		struct slab *slab = slab_get(ibuf->slabc, new_capacity);
		if (slab == NULL)
			return NULL;
		char *ptr = (char *) slab_data(slab);
		memcpy(ptr, ibuf->rpos, used);
		if (ibuf->buf)
			slab_put(ibuf->slabc, slab_from_data(ibuf->buf));
		ibuf->buf = ptr;
		ibuf->end = ibuf->buf + slab_capacity(slab);
	}
	ibuf->rpos = ibuf->buf;
	ibuf->wpos = ibuf->rpos + used;
	return ibuf->wpos;
}